

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyxmlparser.cpp
# Opt level: O1

char * __thiscall
TiXmlText::Parse(TiXmlText *this,char *p,TiXmlParsingData *data,TiXmlEncoding encoding)

{
  TiXmlString *this_00;
  char *pcVar1;
  bool bVar2;
  TiXmlDocument *this_01;
  char *pcVar3;
  char *pcVar4;
  TiXmlString dummy;
  char local_39;
  TiXmlString local_38;
  
  this_00 = &(this->super_TiXmlNode).value;
  TiXmlString::assign(this_00,"",0);
  this_01 = TiXmlNode::GetDocument(&this->super_TiXmlNode);
  if (data != (TiXmlParsingData *)0x0) {
    TiXmlParsingData::Stamp(data,p,encoding);
    (this->super_TiXmlNode).super_TiXmlBase.location = data->cursor;
  }
  if ((this->cdata != false) ||
     (bVar2 = TiXmlBase::StringEqual(p,"<![CDATA[",false,encoding), bVar2)) {
    this->cdata = true;
    bVar2 = TiXmlBase::StringEqual(p,"<![CDATA[",false,encoding);
    if (bVar2) {
      pcVar3 = p + 9;
      if (p[9] != '\0') {
        pcVar4 = p + 9;
        do {
          bVar2 = TiXmlBase::StringEqual(pcVar4,"]]>",false,encoding);
          pcVar3 = pcVar4;
          if (bVar2) break;
          local_39 = *pcVar4;
          TiXmlString::append(this_00,&local_39,1);
          pcVar3 = pcVar4 + 1;
          pcVar1 = pcVar4 + 1;
          pcVar4 = pcVar3;
        } while (*pcVar1 != '\0');
      }
      local_38.rep_ = &TiXmlString::nullrep_;
      pcVar3 = TiXmlBase::ReadText(pcVar3,&local_38,false,"]]>",false,encoding);
      if (local_38.rep_ != (Rep *)0x0 && local_38.rep_ != &TiXmlString::nullrep_) {
        operator_delete__(local_38.rep_);
      }
    }
    else {
      if (this_01 != (TiXmlDocument *)0x0) {
        TiXmlDocument::SetError(this_01,0xe,p,data,encoding);
      }
      pcVar3 = (char *)0x0;
    }
  }
  else {
    pcVar4 = TiXmlBase::ReadText(p,this_00,true,"<",false,encoding);
    pcVar3 = (char *)0x0;
    if (pcVar4 != (char *)0x0) {
      pcVar3 = (char *)0x0;
      if (*pcVar4 != '\0') {
        pcVar3 = pcVar4 + -1;
      }
    }
  }
  return pcVar3;
}

Assistant:

const char* TiXmlText::Parse( const char* p, TiXmlParsingData* data, TiXmlEncoding encoding )
{
	value = "";
	TiXmlDocument* document = GetDocument();

	if ( data )
	{
		data->Stamp( p, encoding );
		location = data->Cursor();
	}

	const char* const startTag = "<![CDATA[";
	const char* const endTag   = "]]>";

	if ( cdata || StringEqual( p, startTag, false, encoding ) )
	{
		cdata = true;

		if ( !StringEqual( p, startTag, false, encoding ) )
		{
			if ( document )
				document->SetError( TIXML_ERROR_PARSING_CDATA, p, data, encoding );
			return 0;
		}
		p += strlen( startTag );

		// Keep all the white space, ignore the encoding, etc.
		while (	   p && *p
				&& !StringEqual( p, endTag, false, encoding )
			  )
		{
			value += *p;
			++p;
		}

		TIXML_STRING dummy; 
		p = ReadText( p, &dummy, false, endTag, false, encoding );
		return p;
	}
	else
	{
		bool ignoreWhite = true;

		const char* end = "<";
		p = ReadText( p, &value, ignoreWhite, end, false, encoding );
		if ( p && *p )
			return p-1;	// don't truncate the '<'
		return 0;
	}
}